

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::Embed::Embed
          (Embed *this,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *title,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *type,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *url,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *timestamp,omittable_field<int> *color,
          omittable_field<discordpp::EmbedFooter> *footer,
          omittable_field<discordpp::EmbedImage> *image,
          omittable_field<discordpp::EmbedThumbnail> *thumbnail,
          omittable_field<discordpp::EmbedVideo> *video,
          omittable_field<discordpp::EmbedProvider> *provider,
          omittable_field<discordpp::EmbedAuthor> *author,
          omittable_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
          *fields)

{
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *timestamp_local;
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *url_local;
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_local;
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *type_local;
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *title_local;
  Embed *this_local;
  
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->title,title);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->type,type);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->description,description);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->url,url);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->timestamp,timestamp);
  omittable_field<int>::omittable_field(&this->color,color);
  omittable_field<discordpp::EmbedFooter>::omittable_field(&this->footer,footer);
  omittable_field<discordpp::EmbedImage>::omittable_field(&this->image,image);
  omittable_field<discordpp::EmbedThumbnail>::omittable_field(&this->thumbnail,thumbnail);
  omittable_field<discordpp::EmbedVideo>::omittable_field(&this->video,video);
  omittable_field<discordpp::EmbedProvider>::omittable_field(&this->provider,provider);
  omittable_field<discordpp::EmbedAuthor>::omittable_field(&this->author,author);
  omittable_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>::
  omittable_field(&this->fields,fields);
  return;
}

Assistant:

Embed(
        omittable_field<std::string> title = omitted,
        omittable_field<std::string> type = omitted,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> url = omitted,
        omittable_field<Timestamp> timestamp = omitted,
        omittable_field<int> color = omitted,
        omittable_field<EmbedFooter> footer = omitted,
        omittable_field<EmbedImage> image = omitted,
        omittable_field<EmbedThumbnail> thumbnail = omitted,
        omittable_field<EmbedVideo> video = omitted,
        omittable_field<EmbedProvider> provider = omitted,
        omittable_field<EmbedAuthor> author = omitted,
        omittable_field<std::vector<EmbedField> > fields = omitted
    ):
        title(title),
        type(type),
        description(description),
        url(url),
        timestamp(timestamp),
        color(color),
        footer(footer),
        image(image),
        thumbnail(thumbnail),
        video(video),
        provider(provider),
        author(author),
        fields(fields)
    {}